

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polyself.c
# Opt level: O1

int domindblast(void)

{
  monst *pmVar1;
  permonst *ppVar2;
  monst *mon;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  obj *poVar6;
  char *pcVar7;
  int iVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  
  if (u.uen < 10) {
    iVar8 = 0;
    pline("You concentrate but lack the energy to maintain doing so.");
  }
  else {
    u.uen = u.uen + -10;
    iflags.botl = '\x01';
    pline("You concentrate.");
    if ((uarmh == (obj *)0x0) || (uarmh->otyp != 0x4f)) {
      pline("A wave of psychic energy pours out.");
      iVar8 = 1;
      pmVar1 = level->monlist;
      while (mon = pmVar1, mon != (monst *)0x0) {
        pmVar1 = mon->nmon;
        if (((0 < mon->mhp) &&
            (iVar3 = dist2((int)mon->mx,(int)mon->my,(int)u.ux,(int)u.uy), iVar3 < 0x41)) &&
           ((*(uint *)&mon->field_0x60 >> 0x16 & 1) == 0)) {
          ppVar2 = mon->data;
          bVar10 = ppVar2 != mons + 0x1e;
          bVar11 = ppVar2 != mons + 0x31;
          bVar12 = ppVar2 != mons + 0x32;
          bVar9 = (*(uint *)&mon->field_0x60 >> 0x11 & 1) != 0;
          if ((((!bVar12 || (!bVar11 || !bVar10)) && !bVar9) ||
              ((!bVar12 || (!bVar11 || !bVar10) && (uVar4 = mt_random(), (uVar4 & 1) != 0)))) ||
             ((uVar4 = mt_random(),
              (uVar4 * -0x33333333 >> 1 | (uint)((uVar4 * -0x33333333 & 1) != 0) << 0x1f) <
              0x1999999a &&
              ((poVar6 = which_armor(mon,4), poVar6 != (obj *)0x0 &&
               (poVar6 = which_armor(mon,4), poVar6->otyp != 0x4f)))))) {
            pcVar5 = mon_nam(mon);
            pcVar5 = s_suffix(pcVar5);
            pcVar7 = "telepathy";
            if (bVar12 && (bVar11 && bVar10) || bVar9) {
              ppVar2 = mon->data;
              pcVar7 = "mind";
              if (ppVar2 == mons + 0x32) {
                pcVar7 = "latent telepathy";
              }
              if (ppVar2 == mons + 0x31) {
                pcVar7 = "latent telepathy";
              }
              if (ppVar2 == mons + 0x1e) {
                pcVar7 = "latent telepathy";
              }
            }
            pline("You lock in on %s %s.",pcVar5,pcVar7);
            uVar4 = mt_random();
            iVar3 = ~(uVar4 % 0xf) + mon->mhp;
            mon->mhp = iVar3;
            if (iVar3 < 1) {
              killed(mon);
            }
          }
        }
      }
    }
    else {
      pcVar5 = yname(uarmh);
      iVar8 = 0;
      pline("A wave of psychic energy pours out, but it is blocked by %s.",pcVar5);
    }
  }
  return iVar8;
}

Assistant:

int domindblast(void)
{
	struct monst *mtmp, *nmon;

	if (u.uen < 10) {
	    pline("You concentrate but lack the energy to maintain doing so.");
	    return 0;
	}
	u.uen -= 10;
	iflags.botl = 1;

	pline("You concentrate.");
	if (uarmh && uarmh->otyp == TINFOIL_HAT) {
		pline("A wave of psychic energy pours out, but it is blocked by %s.",
		      yname(uarmh));
		return 0;
	}
	pline("A wave of psychic energy pours out.");
	for (mtmp=level->monlist; mtmp; mtmp = nmon) {
		int u_sen;

		nmon = mtmp->nmon;
		if (DEADMONSTER(mtmp))
			continue;
		if (distu(mtmp->mx, mtmp->my) > BOLT_LIM * BOLT_LIM)
			continue;
		if (mtmp->mpeaceful)
			continue;
		u_sen = telepathic(mtmp->data) && !mtmp->mcansee;
		if (u_sen || (telepathic(mtmp->data) && rn2(2)) ||
		    (!rn2(10) && which_armor(mtmp, W_ARMH) &&
		     which_armor(mtmp, W_ARMH)->otyp != TINFOIL_HAT)) {
			pline("You lock in on %s %s.", s_suffix(mon_nam(mtmp)),
				u_sen ? "telepathy" :
				telepathic(mtmp->data) ? "latent telepathy" :
				"mind");
			mtmp->mhp -= rnd(15);
			if (mtmp->mhp <= 0)
				killed(mtmp);
		}
	}
	return 1;
}